

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Channel.cpp
# Opt level: O0

void __thiscall sznet::net::Channel::~Channel(Channel *this)

{
  bool bVar1;
  Channel *this_local;
  
  if (((this->m_eventHandling ^ 0xffU) & 1) == 0) {
    __assert_fail("!m_eventHandling",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Channel.cpp"
                  ,0x1b,"sznet::net::Channel::~Channel()");
  }
  if (((this->m_addedToLoop ^ 0xffU) & 1) != 0) {
    bVar1 = EventLoop::isInLoopThread(this->m_loop);
    if ((bVar1) && (bVar1 = EventLoop::hasChannel(this->m_loop,this), ((bVar1 ^ 0xffU) & 1) == 0)) {
      __assert_fail("!m_loop->hasChannel(this)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Channel.cpp"
                    ,0x1f,"sznet::net::Channel::~Channel()");
    }
    std::function<void_()>::~function(&this->m_errorCallback);
    std::function<void_()>::~function(&this->m_closeCallback);
    std::function<void_()>::~function(&this->m_writeCallback);
    std::function<void_(sznet::Timestamp)>::~function(&this->m_readCallback);
    std::weak_ptr<void>::~weak_ptr(&this->m_tie);
    return;
  }
  __assert_fail("!m_addedToLoop",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Channel.cpp"
                ,0x1c,"sznet::net::Channel::~Channel()");
}

Assistant:

Channel::~Channel()
{
	assert(!m_eventHandling);
	assert(!m_addedToLoop);
	if (m_loop->isInLoopThread())
	{
		assert(!m_loop->hasChannel(this));
	}
}